

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_ObjCollectTfo_rec(Acb_Ntk_t *p,int iObj,int fTerm)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  Vec_Int_t *pVVar3;
  int local_20;
  int i;
  int iFanout;
  int fTerm_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjSetTravIdCur(p,iObj);
  if ((iVar1 == 0) && ((fTerm != 0 || (iVar1 = Acb_ObjIsCo(p,iObj), iVar1 == 0)))) {
    local_20 = 0;
    while( true ) {
      pVVar3 = Vec_WecEntry(&p->vFanouts,iObj);
      iVar1 = Vec_IntSize(pVVar3);
      if (iVar1 <= local_20) break;
      pVVar3 = Vec_WecEntry(&p->vFanouts,iObj);
      iVar1 = Vec_IntEntry(pVVar3,local_20);
      AVar2 = Acb_ObjType(p,iVar1);
      if (AVar2 != ABC_OPER_NONE) {
        Acb_ObjCollectTfo_rec(p,iVar1,fTerm);
      }
      local_20 = local_20 + 1;
    }
    Vec_IntPush(&p->vArray1,iObj);
  }
  return;
}

Assistant:

void Acb_ObjCollectTfo_rec( Acb_Ntk_t * p, int iObj, int fTerm )
{
    int iFanout, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( !fTerm && Acb_ObjIsCo(p, iObj) )
        return;
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        Acb_ObjCollectTfo_rec( p, iFanout, fTerm );
    Vec_IntPush( &p->vArray1, iObj );
}